

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_4_to_1_bilinear
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int dst_w,
               int dst_h,__m128i c0c1)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  longlong lVar20;
  long in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar21;
  __m128i c0c1_00;
  __m128i c0c1_01;
  __m128i d [8];
  __m128i s [8];
  int x;
  int y;
  int max_width;
  longlong local_438;
  undefined8 uStack_430;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined8 uStack_420;
  undefined2 local_418;
  undefined2 uStack_416;
  undefined2 uStack_414;
  undefined2 uStack_412;
  undefined2 uStack_410;
  undefined2 uStack_40e;
  undefined2 uStack_40c;
  undefined2 uStack_40a;
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined2 local_3f8;
  undefined2 uStack_3f6;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3f0;
  undefined2 uStack_3ee;
  undefined2 uStack_3ec;
  undefined2 uStack_3ea;
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined2 local_3d8;
  undefined2 uStack_3d6;
  undefined2 uStack_3d4;
  undefined2 uStack_3d2;
  undefined2 uStack_3d0;
  undefined2 uStack_3ce;
  undefined2 uStack_3cc;
  undefined2 uStack_3ca;
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint local_334;
  int local_330;
  uint local_32c;
  long local_308;
  undefined8 *local_300;
  longlong local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  longlong lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_32c = in_R8D + 0xfU & 0xfffffff0;
  local_330 = in_R9D;
  local_308 = in_RCX;
  local_300 = in_RDX;
  local_2f8 = in_RSI;
  local_2f0 = in_RDI;
  do {
    local_334 = local_32c;
    do {
      local_290 = local_2f0;
      local_198 = *local_2f0;
      uStack_210 = local_2f0[1];
      local_298 = local_2f0 + 2;
      local_1b8 = *local_298;
      uStack_230 = local_2f0[3];
      local_2a0 = local_2f0 + 4;
      local_1d8 = *local_2a0;
      uStack_250 = local_2f0[5];
      local_2a8 = local_2f0 + 6;
      local_1f8 = *local_2a8;
      uStack_270 = local_2f0[7];
      local_2b0 = (undefined8 *)((long)local_2f0 + local_2f8);
      local_1a8 = *local_2b0;
      uStack_220 = local_2b0[1];
      local_2b8 = (undefined8 *)((long)local_2f0 + local_2f8 + 0x10);
      local_1c8 = *local_2b8;
      uStack_240 = local_2b8[1];
      local_2c0 = (undefined8 *)((long)local_2f0 + local_2f8 + 0x20);
      local_1e8 = *local_2c0;
      uStack_260 = local_2c0[1];
      local_2c8 = (undefined8 *)((long)local_2f0 + local_2f8 + 0x30);
      local_208 = *local_2c8;
      uStack_280 = local_2c8[1];
      local_218._2_2_ = (undefined2)((ulong)local_198 >> 0x10);
      local_218._4_2_ = (undefined2)((ulong)local_198 >> 0x20);
      local_218._6_2_ = (undefined2)((ulong)local_198 >> 0x30);
      local_228._0_2_ = (undefined2)local_1a8;
      local_228._2_2_ = (undefined2)((ulong)local_1a8 >> 0x10);
      local_228._4_2_ = (undefined2)((ulong)local_1a8 >> 0x20);
      local_228._6_2_ = (undefined2)((ulong)local_1a8 >> 0x30);
      uVar17 = CONCAT22((undefined2)local_228,(short)local_198);
      local_18 = CONCAT26(local_228._2_2_,CONCAT24(local_218._2_2_,uVar17));
      uStack_430._0_4_ = CONCAT22(local_228._4_2_,local_218._4_2_);
      uStack_430 = CONCAT26(local_228._6_2_,CONCAT24(local_218._6_2_,(undefined4)uStack_430));
      uStack_190._2_2_ = (undefined2)((ulong)uStack_210 >> 0x10);
      uStack_190._4_2_ = (undefined2)((ulong)uStack_210 >> 0x20);
      uStack_190._6_2_ = (undefined2)((ulong)uStack_210 >> 0x30);
      uStack_1a0._0_2_ = (undefined2)uStack_220;
      uStack_1a0._2_2_ = (undefined2)((ulong)uStack_220 >> 0x10);
      uStack_1a0._4_2_ = (undefined2)((ulong)uStack_220 >> 0x20);
      uStack_1a0._6_2_ = (undefined2)((ulong)uStack_220 >> 0x30);
      uVar18 = CONCAT22((undefined2)uStack_1a0,(short)uStack_210);
      local_28 = CONCAT26(uStack_1a0._2_2_,CONCAT24(uStack_190._2_2_,uVar18));
      uStack_420._0_4_ = CONCAT22(uStack_1a0._4_2_,uStack_190._4_2_);
      uStack_420 = CONCAT26(uStack_1a0._6_2_,CONCAT24(uStack_190._6_2_,(undefined4)uStack_420));
      local_238._0_2_ = (undefined2)local_1b8;
      local_238._2_2_ = (undefined2)((ulong)local_1b8 >> 0x10);
      local_238._4_2_ = (undefined2)((ulong)local_1b8 >> 0x20);
      local_238._6_2_ = (undefined2)((ulong)local_1b8 >> 0x30);
      local_248._0_2_ = (undefined2)local_1c8;
      local_248._2_2_ = (undefined2)((ulong)local_1c8 >> 0x10);
      local_248._4_2_ = (undefined2)((ulong)local_1c8 >> 0x20);
      local_248._6_2_ = (undefined2)((ulong)local_1c8 >> 0x30);
      uStack_1b0._0_2_ = (undefined2)uStack_230;
      uStack_1b0._2_2_ = (undefined2)((ulong)uStack_230 >> 0x10);
      uStack_1b0._4_2_ = (undefined2)((ulong)uStack_230 >> 0x20);
      uStack_1b0._6_2_ = (undefined2)((ulong)uStack_230 >> 0x30);
      uStack_1c0._0_2_ = (undefined2)uStack_240;
      uStack_1c0._2_2_ = (undefined2)((ulong)uStack_240 >> 0x10);
      uStack_1c0._4_2_ = (undefined2)((ulong)uStack_240 >> 0x20);
      uStack_1c0._6_2_ = (undefined2)((ulong)uStack_240 >> 0x30);
      local_258._0_2_ = (undefined2)local_1d8;
      local_258._2_2_ = (undefined2)((ulong)local_1d8 >> 0x10);
      local_258._4_2_ = (undefined2)((ulong)local_1d8 >> 0x20);
      local_258._6_2_ = (undefined2)((ulong)local_1d8 >> 0x30);
      local_268._0_2_ = (undefined2)local_1e8;
      local_268._2_2_ = (undefined2)((ulong)local_1e8 >> 0x10);
      local_268._4_2_ = (undefined2)((ulong)local_1e8 >> 0x20);
      local_268._6_2_ = (undefined2)((ulong)local_1e8 >> 0x30);
      local_3f8 = (undefined2)local_258;
      uStack_3f6 = (undefined2)local_268;
      uStack_3f4 = local_258._2_2_;
      uStack_3f2 = local_268._2_2_;
      uStack_3f0 = local_258._4_2_;
      uStack_3ee = local_268._4_2_;
      uStack_3ec = local_258._6_2_;
      uStack_3ea = local_268._6_2_;
      uStack_1d0._0_2_ = (undefined2)uStack_250;
      uStack_1d0._2_2_ = (undefined2)((ulong)uStack_250 >> 0x10);
      uStack_1d0._4_2_ = (undefined2)((ulong)uStack_250 >> 0x20);
      uStack_1d0._6_2_ = (undefined2)((ulong)uStack_250 >> 0x30);
      uStack_1e0._0_2_ = (undefined2)uStack_260;
      uStack_1e0._2_2_ = (undefined2)((ulong)uStack_260 >> 0x10);
      uStack_1e0._4_2_ = (undefined2)((ulong)uStack_260 >> 0x20);
      uStack_1e0._6_2_ = (undefined2)((ulong)uStack_260 >> 0x30);
      local_3e8 = (undefined2)uStack_1d0;
      uStack_3e6 = (undefined2)uStack_1e0;
      uStack_3e4 = uStack_1d0._2_2_;
      uStack_3e2 = uStack_1e0._2_2_;
      uStack_3e0 = uStack_1d0._4_2_;
      uStack_3de = uStack_1e0._4_2_;
      uStack_3dc = uStack_1d0._6_2_;
      uStack_3da = uStack_1e0._6_2_;
      local_278._0_2_ = (undefined2)local_1f8;
      local_278._2_2_ = (undefined2)((ulong)local_1f8 >> 0x10);
      local_278._4_2_ = (undefined2)((ulong)local_1f8 >> 0x20);
      local_278._6_2_ = (undefined2)((ulong)local_1f8 >> 0x30);
      local_288._0_2_ = (undefined2)local_208;
      local_288._2_2_ = (undefined2)((ulong)local_208 >> 0x10);
      local_288._4_2_ = (undefined2)((ulong)local_208 >> 0x20);
      local_288._6_2_ = (undefined2)((ulong)local_208 >> 0x30);
      local_3d8 = (undefined2)local_278;
      uStack_3d6 = (undefined2)local_288;
      uStack_3d4 = local_278._2_2_;
      uStack_3d2 = local_288._2_2_;
      uStack_3d0 = local_278._4_2_;
      uStack_3ce = local_288._4_2_;
      uStack_3cc = local_278._6_2_;
      uStack_3ca = local_288._6_2_;
      uStack_1f0._0_2_ = (undefined2)uStack_270;
      uStack_1f0._2_2_ = (undefined2)((ulong)uStack_270 >> 0x10);
      uStack_1f0._4_2_ = (undefined2)((ulong)uStack_270 >> 0x20);
      uStack_1f0._6_2_ = (undefined2)((ulong)uStack_270 >> 0x30);
      uStack_200._0_2_ = (undefined2)uStack_280;
      uStack_200._2_2_ = (undefined2)((ulong)uStack_280 >> 0x10);
      uStack_200._4_2_ = (undefined2)((ulong)uStack_280 >> 0x20);
      uStack_200._6_2_ = (undefined2)((ulong)uStack_280 >> 0x30);
      local_3c8 = (undefined2)uStack_1f0;
      uStack_3c6 = (undefined2)uStack_200;
      uStack_3c4 = uStack_1f0._2_2_;
      uStack_3c2 = uStack_200._2_2_;
      uStack_3c0 = uStack_1f0._4_2_;
      uStack_3be = uStack_200._4_2_;
      uStack_3bc = uStack_1f0._6_2_;
      uStack_3ba = uStack_200._6_2_;
      lStack_90 = uStack_430;
      uStack_a0 = uStack_420;
      local_98._4_4_ = (undefined4)((ulong)local_18 >> 0x20);
      local_a8._4_4_ = (undefined4)((ulong)local_28 >> 0x20);
      local_3b8 = CONCAT44(uVar18,uVar17);
      uStack_3b0 = CONCAT44(local_a8._4_4_,local_98._4_4_);
      uStack_10 = uStack_430;
      lVar20 = uStack_10;
      uStack_20 = uStack_420;
      uVar19 = uStack_20;
      uStack_10._4_4_ = (undefined4)((ulong)uStack_430 >> 0x20);
      uStack_20._4_4_ = (undefined4)((ulong)uStack_420 >> 0x20);
      local_3a8 = CONCAT44((undefined4)uStack_420,(undefined4)uStack_430);
      uStack_3a0 = CONCAT44(uStack_20._4_4_,uStack_10._4_4_);
      uVar2 = CONCAT22((undefined2)local_248,(undefined2)local_238);
      uVar1 = CONCAT26(local_248._2_2_,CONCAT24(local_238._2_2_,uVar2));
      uStack_b0 = CONCAT26(local_248._6_2_,
                           CONCAT24(local_238._6_2_,CONCAT22(local_248._4_2_,local_238._4_2_)));
      uVar6 = CONCAT22((undefined2)uStack_1c0,(undefined2)uStack_1b0);
      uVar5 = CONCAT26(uStack_1c0._2_2_,CONCAT24(uStack_1b0._2_2_,uVar6));
      uStack_c0 = CONCAT26(uStack_1c0._6_2_,
                           CONCAT24(uStack_1b0._6_2_,CONCAT22(uStack_1c0._4_2_,uStack_1b0._4_2_)));
      local_b8._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      local_c8._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      local_398 = CONCAT44(uVar6,uVar2);
      uStack_390 = CONCAT44(local_c8._4_4_,local_b8._4_4_);
      local_38 = CONCAT26(local_248._2_2_,
                          CONCAT24(local_238._2_2_,
                                   CONCAT22((undefined2)local_248,(undefined2)local_238)));
      uVar4 = CONCAT22(local_248._4_2_,local_238._4_2_);
      uVar3 = CONCAT26(local_248._6_2_,CONCAT24(local_238._6_2_,uVar4));
      local_48 = CONCAT26(uStack_1c0._2_2_,
                          CONCAT24(uStack_1b0._2_2_,
                                   CONCAT22((undefined2)uStack_1c0,(undefined2)uStack_1b0)));
      uVar8 = CONCAT22(uStack_1c0._4_2_,uStack_1b0._4_2_);
      uVar7 = CONCAT26(uStack_1c0._6_2_,CONCAT24(uStack_1b0._6_2_,uVar8));
      uStack_30._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      uStack_40._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_388 = CONCAT44(uVar8,uVar4);
      uStack_380 = CONCAT44(uStack_40._4_4_,uStack_30._4_4_);
      uVar9 = CONCAT26(local_268._2_2_,
                       CONCAT24(local_258._2_2_,
                                CONCAT22((undefined2)local_268,(undefined2)local_258)));
      uStack_d0 = CONCAT26(local_268._6_2_,
                           CONCAT24(local_258._6_2_,CONCAT22(local_268._4_2_,local_258._4_2_)));
      uVar11 = CONCAT26(uStack_1e0._2_2_,
                        CONCAT24(uStack_1d0._2_2_,
                                 CONCAT22((undefined2)uStack_1e0,(undefined2)uStack_1d0)));
      uStack_e0 = CONCAT26(uStack_1e0._6_2_,
                           CONCAT24(uStack_1d0._6_2_,CONCAT22(uStack_1e0._4_2_,uStack_1d0._4_2_)));
      local_d8._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      local_e8._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
      local_378 = CONCAT44(CONCAT22((undefined2)uStack_1e0,(undefined2)uStack_1d0),
                           CONCAT22((undefined2)local_268,(undefined2)local_258));
      uStack_370 = CONCAT44(local_e8._4_4_,local_d8._4_4_);
      local_58 = CONCAT26(local_268._2_2_,
                          CONCAT24(local_258._2_2_,
                                   CONCAT22((undefined2)local_268,(undefined2)local_258)));
      uVar10 = CONCAT26(local_268._6_2_,
                        CONCAT24(local_258._6_2_,CONCAT22(local_268._4_2_,local_258._4_2_)));
      local_68 = CONCAT26(uStack_1e0._2_2_,
                          CONCAT24(uStack_1d0._2_2_,
                                   CONCAT22((undefined2)uStack_1e0,(undefined2)uStack_1d0)));
      uVar12 = CONCAT26(uStack_1e0._6_2_,
                        CONCAT24(uStack_1d0._6_2_,CONCAT22(uStack_1e0._4_2_,uStack_1d0._4_2_)));
      uStack_50._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      uStack_60._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
      local_368 = CONCAT44(CONCAT22(uStack_1e0._4_2_,uStack_1d0._4_2_),
                           CONCAT22(local_268._4_2_,local_258._4_2_));
      uStack_360 = CONCAT44(uStack_60._4_4_,uStack_50._4_4_);
      uVar13 = CONCAT26(local_288._2_2_,
                        CONCAT24(local_278._2_2_,
                                 CONCAT22((undefined2)local_288,(undefined2)local_278)));
      uStack_f0 = CONCAT26(local_288._6_2_,
                           CONCAT24(local_278._6_2_,CONCAT22(local_288._4_2_,local_278._4_2_)));
      uVar15 = CONCAT26(uStack_200._2_2_,
                        CONCAT24(uStack_1f0._2_2_,
                                 CONCAT22((undefined2)uStack_200,(undefined2)uStack_1f0)));
      uStack_100 = CONCAT26(uStack_200._6_2_,
                            CONCAT24(uStack_1f0._6_2_,CONCAT22(uStack_200._4_2_,uStack_1f0._4_2_)));
      local_f8._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
      local_108._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
      local_358 = CONCAT44(CONCAT22((undefined2)uStack_200,(undefined2)uStack_1f0),
                           CONCAT22((undefined2)local_288,(undefined2)local_278));
      uStack_350 = CONCAT44(local_108._4_4_,local_f8._4_4_);
      local_78 = CONCAT26(local_288._2_2_,
                          CONCAT24(local_278._2_2_,
                                   CONCAT22((undefined2)local_288,(undefined2)local_278)));
      uVar14 = CONCAT26(local_288._6_2_,
                        CONCAT24(local_278._6_2_,CONCAT22(local_288._4_2_,local_278._4_2_)));
      local_88 = CONCAT26(uStack_200._2_2_,
                          CONCAT24(uStack_1f0._2_2_,
                                   CONCAT22((undefined2)uStack_200,(undefined2)uStack_1f0)));
      uVar16 = CONCAT26(uStack_200._6_2_,
                        CONCAT24(uStack_1f0._6_2_,CONCAT22(uStack_200._4_2_,uStack_1f0._4_2_)));
      uStack_70._4_4_ = (undefined4)((ulong)uVar14 >> 0x20);
      uStack_80._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
      local_348 = CONCAT44(CONCAT22(uStack_200._4_2_,uStack_1f0._4_2_),
                           CONCAT22(local_288._4_2_,local_278._4_2_));
      uStack_340 = CONCAT44(uStack_80._4_4_,uStack_70._4_4_);
      uStack_110 = uStack_3b0;
      local_128 = local_3a8;
      uStack_120 = uStack_3a0;
      local_438 = CONCAT44((undefined4)uStack_430,uVar17);
      uStack_430 = CONCAT44((undefined4)uStack_420,uVar18);
      local_138 = local_398;
      uStack_130 = uStack_390;
      local_148 = local_388;
      uStack_140 = uStack_380;
      _local_428 = CONCAT44(uVar4,uVar2);
      uStack_420 = CONCAT44(uVar8,uVar6);
      local_158 = local_378;
      uStack_150 = uStack_370;
      local_168 = local_368;
      uStack_160 = uStack_360;
      local_418 = (undefined2)local_258;
      uStack_416 = (undefined2)local_268;
      uStack_414 = local_258._4_2_;
      uStack_412 = local_268._4_2_;
      uStack_410 = (undefined2)uStack_1d0;
      uStack_40e = (undefined2)uStack_1e0;
      uStack_40c = uStack_1d0._4_2_;
      uStack_40a = uStack_1e0._4_2_;
      local_178 = local_358;
      uStack_170 = uStack_350;
      local_188 = local_348;
      uStack_180 = uStack_340;
      local_408 = (undefined2)local_278;
      uStack_406 = (undefined2)local_288;
      uStack_404 = local_278._4_2_;
      uStack_402 = local_288._4_2_;
      uStack_400 = (undefined2)uStack_1f0;
      uStack_3fe = (undefined2)uStack_200;
      uStack_3fc = uStack_1f0._4_2_;
      uStack_3fa = uStack_200._4_2_;
      alVar21[1] = (longlong)in_RDX;
      alVar21[0] = in_RSI;
      local_288 = local_208;
      local_278 = local_1f8;
      local_268 = local_1e8;
      local_258 = local_1d8;
      local_248 = local_1c8;
      local_238 = local_1b8;
      local_228 = local_1a8;
      local_218 = local_198;
      uStack_200 = uStack_280;
      uStack_1f0 = uStack_270;
      uStack_1e0 = uStack_260;
      uStack_1d0 = uStack_250;
      uStack_1c0 = uStack_240;
      uStack_1b0 = uStack_230;
      uStack_1a0 = uStack_220;
      uStack_190 = uStack_210;
      local_118 = local_3b8;
      local_108 = uVar15;
      local_f8 = uVar13;
      local_e8 = uVar11;
      local_d8 = uVar9;
      local_c8 = uVar5;
      local_b8 = uVar1;
      local_a8 = local_28;
      local_98 = local_18;
      uStack_80 = uVar16;
      uStack_70 = uVar14;
      uStack_60 = uVar12;
      uStack_50 = uVar10;
      uStack_40 = uVar7;
      uStack_30 = uVar3;
      uStack_20 = uVar19;
      uStack_10 = lVar20;
      alVar21 = scale_plane_bilinear_kernel((__m128i *)&local_438,alVar21);
      c0c1_00[1] = alVar21[1];
      c0c1_00[0] = in_RSI;
      alVar21 = scale_plane_bilinear_kernel((__m128i *)&local_418,c0c1_00);
      c0c1_01[1] = alVar21[1];
      c0c1_01[0] = in_RSI;
      alVar21 = scale_plane_bilinear_kernel((__m128i *)&local_438,c0c1_01);
      in_RDX = alVar21[1];
      local_2d0 = local_300;
      *local_300 = extraout_XMM0_Qa;
      local_300[1] = extraout_XMM0_Qb;
      local_2f0 = local_2f0 + 8;
      local_300 = local_300 + 2;
      local_334 = local_334 - 0x10;
    } while (local_334 != 0);
    local_2f0 = (undefined8 *)((local_2f8 - (int)local_32c) * 4 + (long)local_2f0);
    local_300 = (undefined8 *)((local_308 - (int)local_32c) + (long)local_300);
    local_330 = local_330 + -1;
  } while (local_330 != 0);
  return;
}

Assistant:

static void scale_plane_4_to_1_bilinear(const uint8_t *src,
                                        const ptrdiff_t src_stride,
                                        uint8_t *dst,
                                        const ptrdiff_t dst_stride,
                                        const int dst_w, const int dst_h,
                                        const __m128i c0c1) {
  const int max_width = (dst_w + 15) & ~15;
  int y = dst_h;

  do {
    int x = max_width;
    do {
      __m128i s[8], d[8];

      // Note: Using _mm_packus_epi32() in SSE4.1 could be faster.
      //       Here we tried to not use shuffle instructions which would be slow
      //       on some x86 CPUs.

      // Horizontal
      // 000 001 xx xx 004 005 xx xx  008 009 xx xx 00C 00D xx xx
      // 010 011 xx xx 014 015 xx xx  018 019 xx xx 01C 01D xx xx
      // 020 021 xx xx 024 025 xx xx  028 029 xx xx 02C 02D xx xx
      // 030 031 xx xx 034 035 xx xx  038 039 xx xx 03C 03D xx xx
      // 100 101 xx xx 104 105 xx xx  108 109 xx xx 10C 10D xx xx
      // 110 111 xx xx 114 115 xx xx  118 119 xx xx 11C 11D xx xx
      // 120 121 xx xx 124 125 xx xx  128 129 xx xx 12C 12D xx xx
      // 130 131 xx xx 134 135 xx xx  138 139 xx xx 13C 13D xx xx
      s[0] = _mm_loadu_si128((const __m128i *)(&src[0]));
      s[1] = _mm_loadu_si128((const __m128i *)(&src[16]));
      s[2] = _mm_loadu_si128((const __m128i *)(&src[32]));
      s[3] = _mm_loadu_si128((const __m128i *)(&src[48]));
      s[4] = _mm_loadu_si128((const __m128i *)(src + src_stride + 0));
      s[5] = _mm_loadu_si128((const __m128i *)(src + src_stride + 16));
      s[6] = _mm_loadu_si128((const __m128i *)(src + src_stride + 32));
      s[7] = _mm_loadu_si128((const __m128i *)(src + src_stride + 48));

      // 000 001 100 101 xx xx xx xx  004 005 104 105 xx xx xx xx
      // 008 009 108 109 xx xx xx xx  00C 00D 10C 10D xx xx xx xx
      // 010 011 110 111 xx xx xx xx  014 015 114 115 xx xx xx xx
      // 018 019 118 119 xx xx xx xx  01C 01D 11C 11D xx xx xx xx
      // 020 021 120 121 xx xx xx xx  024 025 124 125 xx xx xx xx
      // 028 029 128 129 xx xx xx xx  02C 02D 12C 12D xx xx xx xx
      // 030 031 130 131 xx xx xx xx  034 035 134 135 xx xx xx xx
      // 038 039 138 139 xx xx xx xx  03C 03D 13C 13D xx xx xx xx
      d[0] = _mm_unpacklo_epi16(s[0], s[4]);
      d[1] = _mm_unpackhi_epi16(s[0], s[4]);
      d[2] = _mm_unpacklo_epi16(s[1], s[5]);
      d[3] = _mm_unpackhi_epi16(s[1], s[5]);
      d[4] = _mm_unpacklo_epi16(s[2], s[6]);
      d[5] = _mm_unpackhi_epi16(s[2], s[6]);
      d[6] = _mm_unpacklo_epi16(s[3], s[7]);
      d[7] = _mm_unpackhi_epi16(s[3], s[7]);

      // 000 001 100 101 008 009 108 109  xx xx xx xx xx xx xx xx
      // 004 005 104 105 00C 00D 10C 10D  xx xx xx xx xx xx xx xx
      // 010 011 110 111 018 019 118 119  xx xx xx xx xx xx xx xx
      // 014 015 114 115 01C 01D 11C 11D  xx xx xx xx xx xx xx xx
      // 020 021 120 121 028 029 128 129  xx xx xx xx xx xx xx xx
      // 024 025 124 125 02C 02D 12C 12D  xx xx xx xx xx xx xx xx
      // 030 031 130 131 038 039 138 139  xx xx xx xx xx xx xx xx
      // 034 035 134 135 03C 03D 13C 13D  xx xx xx xx xx xx xx xx
      s[0] = _mm_unpacklo_epi32(d[0], d[1]);
      s[1] = _mm_unpackhi_epi32(d[0], d[1]);
      s[2] = _mm_unpacklo_epi32(d[2], d[3]);
      s[3] = _mm_unpackhi_epi32(d[2], d[3]);
      s[4] = _mm_unpacklo_epi32(d[4], d[5]);
      s[5] = _mm_unpackhi_epi32(d[4], d[5]);
      s[6] = _mm_unpacklo_epi32(d[6], d[7]);
      s[7] = _mm_unpackhi_epi32(d[6], d[7]);

      // 000 001 100 101 004 005 104 105  008 009 108 109 00C 00D 10C 10D
      // 010 011 110 111 014 015 114 115  018 019 118 119 01C 01D 11C 11D
      // 020 021 120 121 024 025 124 125  028 029 128 129 02C 02D 12C 12D
      // 030 031 130 131 034 035 134 135  038 039 138 139 03C 03D 13C 13D
      d[0] = _mm_unpacklo_epi32(s[0], s[1]);
      d[1] = _mm_unpacklo_epi32(s[2], s[3]);
      d[2] = _mm_unpacklo_epi32(s[4], s[5]);
      d[3] = _mm_unpacklo_epi32(s[6], s[7]);

      d[0] = scale_plane_bilinear_kernel(&d[0], c0c1);
      d[1] = scale_plane_bilinear_kernel(&d[2], c0c1);

      // Vertical
      d[0] = scale_plane_bilinear_kernel(d, c0c1);

      _mm_storeu_si128((__m128i *)dst, d[0]);
      src += 64;
      dst += 16;
      x -= 16;
    } while (x);
    src += 4 * (src_stride - max_width);
    dst += dst_stride - max_width;
  } while (--y);
}